

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O2

void __thiscall
helics::FilterInfo::addSourceEndpoint
          (FilterInfo *this,GlobalHandle dest,string_view sourceName,string_view sourceType)

{
  pointer pGVar1;
  pointer pEVar2;
  EptInformation *ti;
  pointer pEVar3;
  GlobalHandle dest_local;
  string_view sourceType_local;
  string_view sourceName_local;
  
  sourceType_local._M_str = sourceType._M_str;
  sourceType_local._M_len = sourceType._M_len;
  sourceName_local._M_str = sourceName._M_str;
  sourceName_local._M_len = sourceName._M_len;
  pEVar3 = (this->sourceEndpoints).
           super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
           _M_impl.super__Vector_impl_data._M_start;
LAB_00309a8d:
  pEVar2 = pEVar3;
  if (pEVar2 == (this->sourceEndpoints).
                super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    dest_local = dest;
    std::vector<helics::EptInformation,std::allocator<helics::EptInformation>>::
    emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<helics::EptInformation,std::allocator<helics::EptInformation>> *)
               &this->sourceEndpoints,&dest_local,&sourceName_local,&sourceType_local);
    std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::reserve
              (&this->sourceTargets,
               ((long)(this->sourceEndpoints).
                      super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->sourceEndpoints).
                     super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x48);
    pGVar1 = (this->sourceTargets).
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->sourceTargets).
        super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != pGVar1) {
      (this->sourceTargets).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pGVar1;
    }
    (this->sourceEpts)._M_string_length = 0;
    *(this->sourceEpts)._M_dataplus._M_p = '\0';
    pEVar2 = (this->sourceEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pEVar3 = (this->sourceEndpoints).
                  super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                  ._M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar2; pEVar3 = pEVar3 + 1)
    {
      std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
      emplace_back<helics::GlobalHandle_const&>
                ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
                 &this->sourceTargets,&pEVar3->id);
    }
  }
  else {
    pEVar3 = pEVar2 + 1;
    if (((pEVar2->id).fed_id.gid != dest.fed_id.gid.gid) ||
       ((pEVar2->id).handle.hid != dest.handle.hid.hid)) goto LAB_00309a8d;
  }
  return;
}

Assistant:

void FilterInfo::addSourceEndpoint(GlobalHandle dest,
                                   std::string_view sourceName,
                                   std::string_view sourceType)
{
    for (const auto& si : sourceEndpoints) {
        if (si.id == dest) {
            return;
        }
    }
    sourceEndpoints.emplace_back(dest, sourceName, sourceType);
    /** now update the target information*/
    sourceTargets.reserve(sourceEndpoints.size());
    sourceTargets.clear();
    sourceEpts.clear();
    for (const auto& ti : sourceEndpoints) {
        sourceTargets.emplace_back(ti.id);
    }
}